

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O3

void __thiscall
spvtools::opt::DescriptorScalarReplacement::CreateNewDecorationForNewVariable
          (DescriptorScalarReplacement *this,Instruction *old_decoration,uint32_t new_var_id,
          uint32_t new_binding)

{
  uint *puVar1;
  pointer pOVar2;
  IRContext *pIVar3;
  bool bVar4;
  Analysis AVar5;
  Instruction *inst;
  ulong uVar6;
  ulong uVar7;
  undefined1 local_58 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  
  if ((old_decoration->opcode_ != OpDecorate) && (old_decoration->opcode_ != OpDecorateString)) {
    __assert_fail("old_decoration->opcode() == spv::Op::OpDecorate || old_decoration->opcode() == spv::Op::OpDecorateString"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp"
                  ,0x109,
                  "void spvtools::opt::DescriptorScalarReplacement::CreateNewDecorationForNewVariable(Instruction *, uint32_t, uint32_t)"
                 );
  }
  inst = Instruction::Clone(old_decoration,(this->super_Pass).context_);
  puVar1 = (uint *)(local_58 + 0x10);
  local_58._0_8_ = &PTR__SmallVector_00b02ef8;
  local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_58._8_8_ = 1;
  uVar6 = (ulong)(inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar6 = (ulong)inst->has_result_id_;
  }
  pOVar2 = (inst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((long)(inst->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
          -0x5555555555555555;
  local_58._16_4_ = new_var_id;
  if (uVar6 <= uVar7 && uVar7 - uVar6 != 0) {
    local_58._24_8_ = puVar1;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)
               ((long)((pOVar2->words).buffer + 0xfffffffffffffffc) +
               (ulong)(uint)((int)uVar6 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_58);
    local_58._0_8_ = &PTR__SmallVector_00b02ef8;
    if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_38,local_38._M_head_impl);
    }
    bVar4 = anon_unknown_17::IsDecorationBinding(inst);
    if (bVar4) {
      local_58._0_8_ = &PTR__SmallVector_00b02ef8;
      local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_58._8_8_ = 1;
      uVar6 = (ulong)(inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar6 = (ulong)inst->has_result_id_;
      }
      uVar6 = uVar6 + 2;
      pOVar2 = (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar7 = ((long)(inst->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
              -0x5555555555555555;
      local_58._16_4_ = new_binding;
      if (uVar7 < uVar6 || uVar7 - uVar6 == 0) goto LAB_0055d867;
      local_58._24_8_ = puVar1;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)
                 ((long)((pOVar2->words).buffer + 0xfffffffffffffffc) +
                 (ulong)(uint)((int)uVar6 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_58);
      local_58._0_8_ = &PTR__SmallVector_00b02ef8;
      if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_38,local_38._M_head_impl);
      }
    }
    pIVar3 = (this->super_Pass).context_;
    AVar5 = pIVar3->valid_analyses_;
    if ((AVar5 & kAnalysisDecorations) != kAnalysisNone) {
      analysis::DecorationManager::AddDecoration
                ((pIVar3->decoration_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
                 _M_head_impl,inst);
      AVar5 = pIVar3->valid_analyses_;
    }
    if ((AVar5 & kAnalysisBegin) != kAnalysisNone) {
      analysis::DefUseManager::AnalyzeInstDefUse
                ((pIVar3->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,inst);
    }
    utils::IntrusiveList<spvtools::opt::Instruction>::push_back
              (&(((pIVar3->module_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                  .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->annotations_
                ).super_IntrusiveList<spvtools::opt::Instruction>,inst);
    return;
  }
LAB_0055d867:
  local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_58._8_8_ = 1;
  local_58._0_8_ = &PTR__SmallVector_00b02ef8;
  local_58._24_8_ = puVar1;
  __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                ,0x2b8,
                "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)");
}

Assistant:

void DescriptorScalarReplacement::CreateNewDecorationForNewVariable(
    Instruction* old_decoration, uint32_t new_var_id, uint32_t new_binding) {
  assert(old_decoration->opcode() == spv::Op::OpDecorate ||
         old_decoration->opcode() == spv::Op::OpDecorateString);
  std::unique_ptr<Instruction> new_decoration(old_decoration->Clone(context()));
  new_decoration->SetInOperand(0, {new_var_id});

  if (IsDecorationBinding(new_decoration.get())) {
    new_decoration->SetInOperand(2, {new_binding});
  }
  context()->AddAnnotationInst(std::move(new_decoration));
}